

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int pagerUndoCallback(void *pCtx,Pgno iPg)

{
  int iVar1;
  sqlite3_backup *p;
  DbPage *pPg;
  long lVar2;
  
  pPg = sqlite3PagerLookup((Pager *)pCtx,iPg);
  iVar1 = 0;
  if (pPg != (DbPage *)0x0) {
    if (pPg->nRef == 1) {
      sqlite3PcacheDrop(pPg);
      iVar1 = 0;
    }
    else {
      iVar1 = readDbPage(pPg);
      if (iVar1 == 0) {
        (**(code **)((long)pCtx + 0x108))(pPg);
      }
      sqlite3PagerUnrefNotNull(pPg);
    }
  }
  for (lVar2 = *(long *)((long)pCtx + 0x70); lVar2 != 0; lVar2 = *(long *)(lVar2 + 0x40)) {
    *(undefined4 *)(lVar2 + 0x18) = 1;
  }
  return iVar1;
}

Assistant:

static int pagerUndoCallback(void *pCtx, Pgno iPg){
  int rc = SQLITE_OK;
  Pager *pPager = (Pager *)pCtx;
  PgHdr *pPg;

  assert( pagerUseWal(pPager) );
  pPg = sqlite3PagerLookup(pPager, iPg);
  if( pPg ){
    if( sqlite3PcachePageRefcount(pPg)==1 ){
      sqlite3PcacheDrop(pPg);
    }else{
      rc = readDbPage(pPg);
      if( rc==SQLITE_OK ){
        pPager->xReiniter(pPg);
      }
      sqlite3PagerUnrefNotNull(pPg);
    }
  }

  /* Normally, if a transaction is rolled back, any backup processes are
  ** updated as data is copied out of the rollback journal and into the
  ** database. This is not generally possible with a WAL database, as
  ** rollback involves simply truncating the log file. Therefore, if one
  ** or more frames have already been written to the log (and therefore
  ** also copied into the backup databases) as part of this transaction,
  ** the backups must be restarted.
  */
  sqlite3BackupRestart(pPager->pBackup);

  return rc;
}